

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O3

double __thiscall
phmap::priv::anon_unknown_0::ProbeStats::PercentileRatio(ProbeStats *this,double Percentile)

{
  double *pdVar1;
  long lVar2;
  double *pdVar3;
  ulong uVar4;
  ulong uVar5;
  double *pdVar6;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> __result;
  double *pdVar7;
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  vector<double,_std::allocator<double>_> r;
  vector<double,_std::allocator<double>_> local_28;
  
  std::vector<double,_std::allocator<double>_>::vector(&local_28,&this->single_table_ratios);
  uVar4 = (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  auVar8._8_4_ = (int)((long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start >> 0x23);
  auVar8._0_8_ = uVar4;
  auVar8._12_4_ = 0x45300000;
  dVar9 = ((auVar8._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0)) * Percentile;
  uVar5 = (ulong)dVar9;
  pdVar7 = local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start +
           ((long)(dVar9 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5);
  if (pdVar7 == local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    pdVar7 = (this->single_table_ratios).super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_start;
    pdVar1 = (this->single_table_ratios).super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_finish;
    pdVar6 = pdVar7 + 1;
    if (pdVar6 != pdVar1 && pdVar7 != pdVar1) {
      dVar9 = *pdVar7;
      do {
        dVar10 = *pdVar6;
        pdVar3 = pdVar6;
        if (dVar10 <= dVar9) {
          dVar10 = dVar9;
          pdVar3 = pdVar7;
        }
        pdVar7 = pdVar3;
        pdVar6 = pdVar6 + 1;
        dVar9 = dVar10;
      } while (pdVar6 != pdVar1);
    }
  }
  else if (local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start !=
           local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish) {
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introselect<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,pdVar7,
               local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
  }
  dVar9 = *pdVar7;
  if (local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return dVar9;
}

Assistant:

double PercentileRatio(double Percentile = 0.95) const {
    auto r = single_table_ratios;
    auto mid = r.begin() + static_cast<size_t>(r.size() * Percentile);
    if (mid != r.end()) {
      std::nth_element(r.begin(), mid, r.end());
      return *mid;
    } else {
      return MaxRatio();
    }
  }